

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall yy::parser::yypush_(parser *this,char *m,state_type s,symbol_type *sym)

{
  stack_symbol_type local_88;
  symbol_type *local_28;
  symbol_type *sym_local;
  char *pcStack_18;
  state_type s_local;
  char *m_local;
  parser *this_local;
  
  local_28 = sym;
  sym_local._7_1_ = s;
  pcStack_18 = m;
  m_local = (char *)this;
  stack_symbol_type::stack_symbol_type(&local_88,s,sym);
  yypush_(this,m,&local_88);
  stack_symbol_type::~stack_symbol_type(&local_88);
  return;
}

Assistant:

void
  parser::yypush_ (const char* m, state_type s, YY_MOVE_REF (symbol_type) sym)
  {
#if 201103L <= YY_CPLUSPLUS
    yypush_ (m, stack_symbol_type (s, std::move (sym)));
#else
    stack_symbol_type ss (s, sym);
    yypush_ (m, ss);
#endif
  }